

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# HMpsFF.cpp
# Opt level: O0

HighsInt __thiscall
free_format_parser::HMpsFF::fillMatrix(HMpsFF *this,HighsLogOptions *log_options)

{
  __tuple_element_t<2UL,_tuple<int,_int,_double>_> _Var1;
  __tuple_element_t<1UL,_tuple<int,_int,_double>_> _Var2;
  int iVar3;
  size_type sVar4;
  __tuple_element_t<0UL,_tuple<int,_int,_double>_> *p_Var5;
  __tuple_element_t<2UL,_tuple<int,_int,_double>_> *p_Var6;
  reference pvVar7;
  __tuple_element_t<1UL,_tuple<int,_int,_double>_> *p_Var8;
  reference pvVar9;
  HighsLogOptions *in_RSI;
  size_type in_RDI;
  HighsInt i_1;
  HighsInt col;
  HighsInt i;
  HighsInt nEmptyCols;
  HighsInt k;
  HighsInt newColIndex;
  size_t num_entries;
  undefined4 in_stack_ffffffffffffff98;
  value_type vVar10;
  undefined4 in_stack_ffffffffffffff9c;
  int in_stack_ffffffffffffffa0;
  int in_stack_ffffffffffffffa4;
  undefined4 in_stack_ffffffffffffffc0;
  undefined4 in_stack_ffffffffffffffc4;
  int local_38;
  int local_34;
  int local_2c;
  int local_28;
  HighsInt local_4;
  
  sVar4 = std::vector<std::tuple<int,_int,_double>,_std::allocator<std::tuple<int,_int,_double>_>_>
          ::size((vector<std::tuple<int,_int,_double>,_std::allocator<std::tuple<int,_int,_double>_>_>
                  *)(in_RDI + 0x2b8));
  if (sVar4 == (long)*(int *)(in_RDI + 0x20)) {
    std::vector<double,_std::allocator<double>_>::resize
              ((vector<double,_std::allocator<double>_> *)
               CONCAT44(in_stack_ffffffffffffffc4,in_stack_ffffffffffffffc0),in_RDI);
    std::vector<int,_std::allocator<int>_>::resize
              ((vector<int,_std::allocator<int>_> *)
               CONCAT44(in_stack_ffffffffffffffc4,in_stack_ffffffffffffffc0),in_RDI);
    std::vector<int,_std::allocator<int>_>::assign
              ((vector<int,_std::allocator<int>_> *)
               CONCAT44(in_stack_ffffffffffffffa4,in_stack_ffffffffffffffa0),
               CONCAT44(in_stack_ffffffffffffff9c,in_stack_ffffffffffffff98),
               (value_type_conflict2 *)0x45d43d);
    if (sVar4 == 0) {
      local_4 = 0;
    }
    else {
      std::vector<std::tuple<int,_int,_double>,_std::allocator<std::tuple<int,_int,_double>_>_>::at
                ((vector<std::tuple<int,_int,_double>,_std::allocator<std::tuple<int,_int,_double>_>_>
                  *)CONCAT44(in_stack_ffffffffffffffa4,in_stack_ffffffffffffffa0),
                 CONCAT44(in_stack_ffffffffffffff9c,in_stack_ffffffffffffff98));
      p_Var5 = std::get<0ul,int,int,double>((tuple<int,_int,_double> *)0x45d46f);
      local_28 = *p_Var5;
      for (local_2c = 0; local_38 = local_28, local_2c < *(int *)(in_RDI + 0x20);
          local_2c = local_2c + 1) {
        std::vector<std::tuple<int,_int,_double>,_std::allocator<std::tuple<int,_int,_double>_>_>::
        at((vector<std::tuple<int,_int,_double>,_std::allocator<std::tuple<int,_int,_double>_>_> *)
           CONCAT44(in_stack_ffffffffffffffa4,in_stack_ffffffffffffffa0),
           CONCAT44(in_stack_ffffffffffffff9c,in_stack_ffffffffffffff98));
        p_Var6 = std::get<2ul,int,int,double>((tuple<int,_int,_double> *)0x45d4ad);
        _Var1 = *p_Var6;
        pvVar7 = std::vector<double,_std::allocator<double>_>::at
                           ((vector<double,_std::allocator<double>_> *)
                            CONCAT44(in_stack_ffffffffffffffa4,in_stack_ffffffffffffffa0),
                            CONCAT44(in_stack_ffffffffffffff9c,in_stack_ffffffffffffff98));
        *pvVar7 = _Var1;
        std::vector<std::tuple<int,_int,_double>,_std::allocator<std::tuple<int,_int,_double>_>_>::
        at((vector<std::tuple<int,_int,_double>,_std::allocator<std::tuple<int,_int,_double>_>_> *)
           CONCAT44(in_stack_ffffffffffffffa4,in_stack_ffffffffffffffa0),
           CONCAT44(in_stack_ffffffffffffff9c,in_stack_ffffffffffffff98));
        p_Var8 = std::get<1ul,int,int,double>((tuple<int,_int,_double> *)0x45d4f5);
        _Var2 = *p_Var8;
        pvVar9 = std::vector<int,_std::allocator<int>_>::at
                           ((vector<int,_std::allocator<int>_> *)
                            CONCAT44(in_stack_ffffffffffffffa4,in_stack_ffffffffffffffa0),
                            CONCAT44(in_stack_ffffffffffffff9c,in_stack_ffffffffffffff98));
        *pvVar9 = _Var2;
        std::vector<std::tuple<int,_int,_double>,_std::allocator<std::tuple<int,_int,_double>_>_>::
        at((vector<std::tuple<int,_int,_double>,_std::allocator<std::tuple<int,_int,_double>_>_> *)
           CONCAT44(in_stack_ffffffffffffffa4,in_stack_ffffffffffffffa0),
           CONCAT44(in_stack_ffffffffffffff9c,in_stack_ffffffffffffff98));
        p_Var5 = std::get<0ul,int,int,double>((tuple<int,_int,_double> *)0x45d532);
        if (*p_Var5 != local_28) {
          std::vector<std::tuple<int,_int,_double>,_std::allocator<std::tuple<int,_int,_double>_>_>
          ::at((vector<std::tuple<int,_int,_double>,_std::allocator<std::tuple<int,_int,_double>_>_>
                *)CONCAT44(in_stack_ffffffffffffffa4,in_stack_ffffffffffffffa0),
               CONCAT44(in_stack_ffffffffffffff9c,in_stack_ffffffffffffff98));
          p_Var5 = std::get<0ul,int,int,double>((tuple<int,_int,_double> *)0x45d55c);
          iVar3 = *p_Var5 - local_28;
          std::vector<std::tuple<int,_int,_double>,_std::allocator<std::tuple<int,_int,_double>_>_>
          ::at((vector<std::tuple<int,_int,_double>,_std::allocator<std::tuple<int,_int,_double>_>_>
                *)CONCAT44(in_stack_ffffffffffffffa4,in_stack_ffffffffffffffa0),
               CONCAT44(in_stack_ffffffffffffff9c,in_stack_ffffffffffffff98));
          p_Var5 = std::get<0ul,int,int,double>((tuple<int,_int,_double> *)0x45d584);
          local_28 = *p_Var5;
          if (*(int *)(in_RDI + 0x1c) <= local_28) {
            return 1;
          }
          in_stack_ffffffffffffffa4 = local_2c;
          pvVar9 = std::vector<int,_std::allocator<int>_>::at
                             ((vector<int,_std::allocator<int>_> *)
                              CONCAT44(local_2c,in_stack_ffffffffffffffa0),
                              CONCAT44(in_stack_ffffffffffffff9c,in_stack_ffffffffffffff98));
          *pvVar9 = in_stack_ffffffffffffffa4;
          for (local_34 = 1; local_34 < iVar3; local_34 = local_34 + 1) {
            in_stack_ffffffffffffffa0 = local_2c;
            pvVar9 = std::vector<int,_std::allocator<int>_>::at
                               ((vector<int,_std::allocator<int>_> *)
                                CONCAT44(in_stack_ffffffffffffffa4,local_2c),
                                CONCAT44(in_stack_ffffffffffffff9c,in_stack_ffffffffffffff98));
            *pvVar9 = in_stack_ffffffffffffffa0;
          }
        }
      }
      while (local_38 = local_38 + 1, local_38 <= *(int *)(in_RDI + 0x1c)) {
        vVar10 = *(value_type *)(in_RDI + 0x20);
        pvVar9 = std::vector<int,_std::allocator<int>_>::operator[]
                           ((vector<int,_std::allocator<int>_> *)(in_RDI + 0x58),(long)local_38);
        *pvVar9 = vVar10;
      }
      for (iVar3 = 0; iVar3 < *(int *)(in_RDI + 0x1c); iVar3 = iVar3 + 1) {
        pvVar9 = std::vector<int,_std::allocator<int>_>::operator[]
                           ((vector<int,_std::allocator<int>_> *)(in_RDI + 0x58),(long)iVar3);
        vVar10 = *pvVar9;
        pvVar9 = std::vector<int,_std::allocator<int>_>::operator[]
                           ((vector<int,_std::allocator<int>_> *)(in_RDI + 0x58),(long)(iVar3 + 1));
        if (*pvVar9 < vVar10) {
          highsLogUser(in_RSI,kError,"Non-monotonic starts in MPS file reader\n");
          return 1;
        }
      }
      local_4 = 0;
    }
  }
  else {
    local_4 = 1;
  }
  return local_4;
}

Assistant:

HighsInt HMpsFF::fillMatrix(const HighsLogOptions& log_options) {
  size_t num_entries = entries.size();
  if (num_entries != static_cast<size_t>(num_nz)) return 1;

  a_value.resize(num_nz);
  a_index.resize(num_nz);
  a_start.assign(num_col + 1, 0);
  // Nothing to do if there are no entries in the matrix
  if (!num_entries) return 0;

  HighsInt newColIndex = std::get<0>(entries.at(0));

  for (HighsInt k = 0; k < num_nz; k++) {
    a_value.at(k) = std::get<2>(entries.at(k));
    a_index.at(k) = std::get<1>(entries.at(k));

    if (std::get<0>(entries.at(k)) != newColIndex) {
      HighsInt nEmptyCols = std::get<0>(entries.at(k)) - newColIndex;
      newColIndex = std::get<0>(entries.at(k));
      if (newColIndex >= num_col) return 1;

      a_start.at(newColIndex) = k;
      for (HighsInt i = 1; i < nEmptyCols; i++) {
        a_start.at(newColIndex - i) = k;
      }
    }
  }

  for (HighsInt col = newColIndex + 1; col <= num_col; col++)
    a_start[col] = num_nz;

  for (HighsInt i = 0; i < num_col; i++) {
    if (a_start[i] > a_start[i + 1]) {
      highsLogUser(log_options, HighsLogType::kError,
                   "Non-monotonic starts in MPS file reader\n");
      return 1;
    }
  }

  return 0;
}